

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O3

void bandit::it(char *desc,voidfunc_t *func,listener *listener,contextstack_t *context_stack,
               assertion_adapter *assertion_adapter,run_policy *run_policy)

{
  int iVar1;
  _Elt_pointer ppcVar2;
  bool we_have_been_successful_so_far;
  string err;
  anon_class_8_1_00c47a18 run_after_eaches;
  anon_class_8_1_00c47a18 run_before_eaches;
  undefined1 local_109;
  char *local_108 [12];
  contextstack_t *local_a8;
  contextstack_t *local_a0;
  long *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  long *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  local_108[0] = desc;
  iVar1 = (*run_policy->_vptr_run_policy[2])(run_policy,desc,context_stack);
  if ((char)iVar1 == '\0') {
    std::function<void_()>::function((function<void_()> *)&local_50,func);
    (*listener->_vptr_listener[0xb])(listener,desc);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  else {
    (*listener->_vptr_listener[7])(listener,desc);
    ppcVar2 = (context_stack->
              super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
              )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppcVar2 ==
        (context_stack->
        super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>).
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar2 = (context_stack->
                super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
                )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    (*ppcVar2[-1]->_vptr_context[3])();
    local_109 = 0;
    local_78 = (long *)0x0;
    uStack_70 = 0;
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_a8 = context_stack;
    local_a0 = context_stack;
    local_78 = (long *)operator_new(0x18);
    *local_78 = (long)&local_a0;
    local_78[1] = (long)func;
    local_78[2] = (long)&local_109;
    pcStack_60 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lostlevels[P]rms/test/bandit/grammar.h:123:42)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lostlevels[P]rms/test/bandit/grammar.h:123:42)>
               ::_M_manager;
    (*(code *)**(undefined8 **)assertion_adapter)(assertion_adapter);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98 = (long *)0x0;
    uStack_90 = 0;
    local_98 = (long *)operator_new(0x20);
    *local_98 = (long)&local_a8;
    local_98[1] = (long)&local_109;
    local_98[2] = (long)listener;
    local_98[3] = (long)local_108;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lostlevels[P]rms/test/bandit/grammar.h:149:42)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lostlevels[P]rms/test/bandit/grammar.h:149:42)>
               ::_M_manager;
    (*(code *)**(undefined8 **)assertion_adapter)(assertion_adapter);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
  }
  return;
}

Assistant:

inline void it(const char* desc, detail::voidfunc_t func, detail::listener& listener,
      detail::contextstack_t& context_stack, 
      bandit::adapters::assertion_adapter& assertion_adapter, 
      detail::run_policy& run_policy)
  {
    if(!run_policy.should_run(desc, context_stack))
    {
      it_skip(desc, func, listener);
      return;
    }

    listener.it_starting(desc);

    context_stack.back()->execution_is_starting();

    auto run_before_eaches = [&](){
      for_each(context_stack.begin(), context_stack.end(), [](detail::context* ctxt){
          ctxt->run_before_eaches();
      });
    };

    auto run_after_eaches = [&](){
      for_each(context_stack.begin(), context_stack.end(), [](detail::context* ctxt){
          ctxt->run_after_eaches();
      });
    };

    bool we_have_been_successful_so_far = false;
    try
    {
      assertion_adapter.adapt_exceptions([&](){
          run_before_eaches();

          func();
          we_have_been_successful_so_far = true;
      });
    }
    catch(const bandit::detail::assertion_exception& ex)
    {
      listener.it_failed(desc, ex);
      run_policy.encountered_failure();
    }
    catch(const std::exception& ex)
    {
      std::string err = std::string("exception: ") + ex.what();
      listener.it_failed(desc, bandit::detail::assertion_exception(err));
      run_policy.encountered_failure();
    }
    catch(...)
    {
      listener.it_unknown_error(desc);
      run_policy.encountered_failure();
    }

    try
    {
      assertion_adapter.adapt_exceptions([&](){
          run_after_eaches();

          if(we_have_been_successful_so_far) 
          {
            listener.it_succeeded(desc);
          }
      });
    }
    catch(const bandit::detail::assertion_exception& ex)
    {
      listener.it_failed(desc, ex);
      run_policy.encountered_failure();
    }
    catch(const std::exception& ex)
    {
      std::string err = std::string("exception: ") + ex.what();
      listener.it_failed(desc, bandit::detail::assertion_exception(err));
      run_policy.encountered_failure();
    }
    catch(...)
    {
      listener.it_unknown_error(desc);
      run_policy.encountered_failure();
    }
  }